

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc.c
# Opt level: O1

int flatcc_generate_files(flatcc_context_t ctx)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  long *plVar5;
  fb_output_t output;
  fb_output_t local_120;
  
  uVar3 = 0xffffffff;
  if ((ctx != (flatcc_context_t)0x0) && (*(int *)((long)ctx + 0xd0) == 0)) {
    plVar4 = (long *)0x0;
    plVar1 = (long *)ctx;
    do {
      plVar5 = plVar1;
      plVar5[1] = (long)plVar4;
      plVar4 = plVar5;
      plVar1 = (long *)*plVar5;
    } while ((long *)*plVar5 != (long *)0x0);
    if (((*(int *)((long)ctx + 0x1cc) == 0) ||
        (iVar2 = __flatcc_fb_codegen_bfbs_to_file
                           ((fb_options_t *)((long)ctx + 0xf0),(fb_schema_t *)((long)ctx + 0x208)),
        iVar2 == 0)) && (uVar3 = 0, *(int *)((long)ctx + 0x1cc) == 0)) {
      iVar2 = __flatcc_fb_init_output_c(&local_120,(fb_options_t *)((long)ctx + 0xf0));
      uVar3 = 0xffffffff;
      if (iVar2 == 0) {
        if ((*(int *)((long)ctx + 400) != 0) ||
           (uVar3 = __flatcc_fb_codegen_common_c(&local_120), uVar3 == 0)) {
          if (*(int *)((long)ctx + 0xec) == 0) {
            uVar3 = 0;
          }
          else if (*(int *)((long)ctx + 0x1bc) == 0) {
            uVar3 = __flatcc_fb_codegen_c(&local_120,(fb_schema_t *)((long)ctx + 0x208));
          }
          else {
            do {
              uVar3 = 1;
              if ((int)plVar5[0x1a] == 0) {
                iVar2 = __flatcc_fb_codegen_c(&local_120,(fb_schema_t *)(plVar5 + 0x41));
                uVar3 = (uint)(iVar2 != 0);
              }
            } while ((uVar3 == 0) && (plVar5 = (long *)plVar5[1], plVar5 != (long *)0x0));
          }
        }
        __flatcc_fb_end_output_c(&local_120);
      }
    }
  }
  return uVar3;
}

Assistant:

int flatcc_generate_files(flatcc_context_t ctx)
{
    fb_parser_t *P = ctx, *P_leaf;
    fb_output_t *out, output;
    int ret = 0;
    out = &output;

    if (!P || P->failed) {
        return -1;
    }
    P_leaf = 0;
    while (P) {
        P->inverse_dependencies = P_leaf;
        P_leaf = P;
        P = P->dependencies;
    }
    P = ctx;
#if FLATCC_REFLECTION
    if (P->opts.bgen_bfbs) {
        if (fb_codegen_bfbs_to_file(&P->opts, &P->schema)) {
            return -1;
        }
    }
#endif
#ifdef PR216
    /* Note: P->opts.cgen now represents the below expression, and bfbs_gen is mutually exclusive with cgen */
    if (!(P->opts.cgen_reader | P->opts.cgen_builder | P->opts.cgen_verifier
        | P->opts.cgen_common_reader | P->opts.cgen_common_builder
        | P->opts.cgen_json_parser | P->opts.cgen_json_printer)) {
        return 0;
    }
#else
    /* Experimental alternative to PR216 */
    if (P->opts.bgen_bfbs) {
        return 0;
    }
#endif
    if (fb_init_output_c(out, &P->opts)) {
        return -1;
    }
    /* This does not require a parse first. */
    if (!P->opts.gen_append && (ret = fb_codegen_common_c(out))) {
        goto done;
    }
    /* If no file parsed - just common files if at all. */
    if (!P->has_schema) {
        goto done;
    }
    if (!P->opts.cgen_recursive) {
        ret = fb_codegen_c(out, &P->schema);
        goto done;
    }
    /* Make sure stdout and outfile output is generated in the right order. */
    P = P_leaf;
    while (!ret && P) {
        ret = P->failed || fb_codegen_c(out, &P->schema);
        P = P->inverse_dependencies;
    }
done:
    fb_end_output_c(out);
    return ret;
}